

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiReadRequestHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  int ret;
  MPI_Errhandler worldErrHandler;
  MPI_Comm *comm;
  _MpiReadReplyMsg ReadReplyMsg;
  char *RequestedData;
  char *tmpstr;
  CP_Services Svcs;
  MpiStreamWR StreamWR;
  MpiStreamWPR StreamWPR;
  MpiReadRequestMsg ReadRequestMsg;
  size_t in_stack_ffffffffffffff68;
  MpiStreamWR in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined4 *local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  void *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  
  local_38 = *(undefined4 **)(in_RDX + 10);
  local_40 = *(undefined8 **)(local_38 + 6);
  local_48 = in_RCX;
  local_30 = in_RDX;
  (*(code *)*in_RCX)(*local_40,5,
                     "MpiReadRequestHandler:read request from reader=%d,ts=%d,off=%d,len=%d\n",
                     in_RDX[1],*(undefined8 *)(in_RDX + 2),*(undefined8 *)(in_RDX + 6),
                     *(undefined8 *)(in_RDX + 4));
  if (_perfstubs_initialized == 1) {
    if (MpiReadRequestHandler::timer == (void *)0x0) {
      local_50 = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/dp/mpi_dp.c"
                                             ,"MpiReadRequestHandler",0x248);
      MpiReadRequestHandler::timer = (void *)ps_timer_create_(local_50);
      free(local_50);
    }
    ps_timer_start_(MpiReadRequestHandler::timer);
  }
  local_58 = LoadTimeStep(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (local_58 == (char *)0x0) {
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(MpiReadRequestHandler::timer);
    }
    (*(code *)*local_48)
              (*local_40,1,"Failed to read TimeStep %ld, not found\n",*(undefined8 *)(local_30 + 2))
    ;
  }
  else {
    local_88 = 0;
    local_80 = local_38 + 0x20;
    local_78 = *local_30;
    local_70 = *(undefined8 *)(local_30 + 2);
    local_68 = *(undefined8 *)(local_30 + 4);
    local_60 = *(undefined8 *)(local_30 + 8);
    (*(code *)*local_48)
              (*local_40,5,"MpiReadRequestHandler: Replying reader=%d with MPI port name=%s\n",
               local_30[1],local_38 + 0x20);
    (*(code *)local_48[2])
              (*local_40,*(undefined8 *)(local_38 + 2),local_30[1],local_40[3],&local_88);
    puVar2 = (undefined8 *)(*(long *)(local_38 + 0x1e) + (long)(int)local_30[1] * 8);
    MPI_Comm_get_errhandler(&ompi_mpi_comm_world,&stack0xffffffffffffff68);
    MPI_Comm_set_errhandler(&ompi_mpi_comm_world,&ompi_mpi_errors_return);
    iVar1 = MPI_Send(local_58 + *(long *)(local_30 + 6),*(ulong *)(local_30 + 4) & 0xffffffff,
                     &ompi_mpi_char,0,*local_30,*puVar2);
    MPI_Comm_set_errhandler(&ompi_mpi_comm_world,in_stack_ffffffffffffff68);
    if (iVar1 != 0) {
      MPI_Comm_accept(local_38 + 0x20,&ompi_mpi_info_null,0,&ompi_mpi_comm_self,puVar2);
      (*(code *)*local_48)
                (*local_40,5,"MpiReadRequestHandler: Accepted client, Link.CohortSize=%d\n",
                 *local_38);
      MPI_Send(local_58 + *(long *)(local_30 + 6),*(ulong *)(local_30 + 4) & 0xffffffff,
               &ompi_mpi_char,0,*local_30,*puVar2);
    }
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(MpiReadRequestHandler::timer);
    }
  }
  return;
}

Assistant:

static void MpiReadRequestHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                  attr_list attrs)
{
    MpiReadRequestMsg ReadRequestMsg = (MpiReadRequestMsg)msg_v;
    MpiStreamWPR StreamWPR = ReadRequestMsg->StreamWPR;
    MpiStreamWR StreamWR = StreamWPR->StreamWR;
    CP_Services Svcs = (CP_Services)client_Data;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiReadRequestHandler:"
                  "read request from reader=%d,ts=%d,off=%d,len=%d\n",
                  ReadRequestMsg->RequestingRank, ReadRequestMsg->TimeStep, ReadRequestMsg->Offset,
                  ReadRequestMsg->Length);

    PERFSTUBS_TIMER_START_FUNC(timer);

    char *RequestedData = LoadTimeStep(StreamWR, ReadRequestMsg->TimeStep);

    if (!RequestedData)
    {
        PERFSTUBS_TIMER_STOP_FUNC(timer);
        Svcs->verbose(StreamWR->Stream.CP_Stream, DPCriticalVerbose,
                      "Failed to read TimeStep %ld, not found\n", ReadRequestMsg->TimeStep);
        return;
    }

    struct _MpiReadReplyMsg ReadReplyMsg = {
        .TimeStep = ReadRequestMsg->TimeStep,
        .DataLength = ReadRequestMsg->Length,
        .StreamRS = ReadRequestMsg->StreamRS,
        .NotifyCondition = ReadRequestMsg->NotifyCondition,
        .MpiPortName = StreamWPR->MpiPortName,
    };

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiReadRequestHandler: Replying reader=%d with MPI port name=%s\n",
                  ReadRequestMsg->RequestingRank, StreamWPR->MpiPortName);

    Svcs->sendToPeer(StreamWR->Stream.CP_Stream, StreamWPR->Link.PeerCohort,
                     ReadRequestMsg->RequestingRank, StreamWR->ReadReplyFormat, &ReadReplyMsg);

    // Send the actual Data using MPI
    MPI_Comm *comm = &StreamWPR->CohortMpiComms[ReadRequestMsg->RequestingRank];
    MPI_Errhandler worldErrHandler;
    MPI_Comm_get_errhandler(MPI_COMM_WORLD, &worldErrHandler);
    MPI_Comm_set_errhandler(MPI_COMM_WORLD, MPI_ERRORS_RETURN);
    int ret = MPI_Send(RequestedData + ReadRequestMsg->Offset, ReadRequestMsg->Length, MPI_CHAR, 0,
                       ReadRequestMsg->NotifyCondition, *comm);
    MPI_Comm_set_errhandler(MPI_COMM_WORLD, worldErrHandler);

    if (ret != MPI_SUCCESS)
    {
        MPI_Comm_accept(StreamWPR->MpiPortName, MPI_INFO_NULL, 0, MPI_COMM_SELF, comm);
        Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                      "MpiReadRequestHandler: Accepted client, Link.CohortSize=%d\n",
                      StreamWPR->Link.CohortSize);
        MPI_Send(RequestedData + ReadRequestMsg->Offset, ReadRequestMsg->Length, MPI_CHAR, 0,
                 ReadRequestMsg->NotifyCondition, *comm);
    }

    PERFSTUBS_TIMER_STOP_FUNC(timer);
}